

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BadExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BadExpressionSyntax,slang::syntax::BadExpressionSyntax_const&>
          (BumpAllocator *this,BadExpressionSyntax *args)

{
  BadExpressionSyntax *pBVar1;
  undefined8 *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pBVar1 = (BadExpressionSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  *(undefined8 *)&(pBVar1->super_ExpressionSyntax).super_SyntaxNode = *in_RSI;
  (pBVar1->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)in_RSI[1];
  (pBVar1->super_ExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)in_RSI[2];
  (pBVar1->expr).ptr = (ExpressionSyntax *)in_RSI[3];
  return pBVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }